

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O2

void __thiscall Sequence::process_maxgap(Sequence *this,Eqclass_S *L2)

{
  uint uVar1;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *psVar2;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> hdr;
  shared_ptr<Itemset> item;
  __shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  psVar2 = Eqclass::list((L2->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&hdr.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
             (psVar2->
             super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  while (hdr.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr != (element_type *)0x0) {
    std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
               &((hdr.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
    Itemset::operator[](item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               &((hdr.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
    uVar1 = Eqclass::templ((L2->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    process_itemset(this,(Itemset_S *)&local_40,uVar1,3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 hdr.
                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&hdr.
                super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  psVar2 = Eqclass::list2((L2->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
             &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
             (psVar2->
             super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&hdr.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
             &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  while (hdr.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr != (element_type *)0x0) {
    std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
               &((hdr.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
    Itemset::operator[](item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &((hdr.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
    uVar1 = Eqclass::templ2((L2->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    process_itemset(this,(Itemset_S *)&local_50,uVar1,3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 hdr.
                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&hdr.
                super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                &item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&item.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&hdr.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Sequence::process_maxgap(Eqclass_S L2) {
    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr = L2->list()->head();
    for (; hdr; hdr = hdr->next()) {
        auto item = hdr->item();
        auto clsnum = (*item)[0];
        process_itemset(hdr->item(), L2->templ(), 3);
    }

    hdr = L2->list2()->head();
    for (; hdr; hdr = hdr->next()) {
        auto item = hdr->item();
        auto clsnum = (*item)[0];
        process_itemset(hdr->item(), L2->templ2(), 3);
    }
}